

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_groupby.cpp
# Opt level: O1

void __thiscall
duckdb::Transformer::AddGroupByExpression
          (Transformer *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expression,GroupingExpressionMap *map,GroupByNode *result,
          vector<unsigned_long,_true> *result_set)

{
  pointer puVar1;
  iterator __position;
  int iVar2;
  pointer pPVar3;
  BaseExpression *this_00;
  FunctionExpression *pFVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  pointer *__ptr;
  pointer puVar7;
  ParsedExpression *pPVar8;
  idx_t result_idx;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_58;
  key_type local_50;
  int local_44;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_40;
  key_type local_38;
  
  pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expression);
  if ((pPVar3->super_BaseExpression).type == FUNCTION) {
    this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(expression)->super_BaseExpression;
    pFVar4 = BaseExpression::Cast<duckdb::FunctionExpression>(this_00);
    iVar2 = ::std::__cxx11::string::compare((char *)&pFVar4->function_name);
    if (iVar2 == 0) {
      puVar1 = (pFVar4->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_44 = 0;
      local_40 = expression;
      for (puVar7 = (pFVar4->children).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1
          ) {
        local_58._M_head_impl =
             (puVar7->
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (puVar7->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)0x0;
        AddGroupByExpression
                  (this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)&local_58,map,result,result_set);
        if (local_58._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_58._M_head_impl = (ParsedExpression *)0x0;
      }
      expression = local_40;
      if (local_44 == 0) {
        return;
      }
    }
  }
  local_50._M_data =
       unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
       operator*(expression);
  iVar5 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)map,&local_50);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    pPVar8 = (ParsedExpression *)
             ((long)(result->group_expressions).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->group_expressions).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_50._M_data = pPVar8;
    local_38._M_data =
         unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(expression);
    pmVar6 = ::std::__detail::
             _Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)map,&local_38);
    *pmVar6 = (mapped_type)pPVar8;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)result,expression);
  }
  else {
    local_50._M_data =
         *(ParsedExpression **)
          ((long)iVar5.
                 super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_true>
                 ._M_cur + 0x10);
  }
  __position._M_current =
       (result_set->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (result_set->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)result_set,__position,
               (unsigned_long *)&local_50);
  }
  else {
    *__position._M_current = (unsigned_long)local_50._M_data;
    (result_set->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void Transformer::AddGroupByExpression(unique_ptr<ParsedExpression> expression, GroupingExpressionMap &map,
                                       GroupByNode &result, vector<idx_t> &result_set) {
	if (expression->GetExpressionType() == ExpressionType::FUNCTION) {
		auto &func = expression->Cast<FunctionExpression>();
		if (func.function_name == "row") {
			for (auto &child : func.children) {
				AddGroupByExpression(std::move(child), map, result, result_set);
			}
			return;
		}
	}
	auto entry = map.map.find(*expression);
	idx_t result_idx;
	if (entry == map.map.end()) {
		result_idx = result.group_expressions.size();
		map.map[*expression] = result_idx;
		result.group_expressions.push_back(std::move(expression));
	} else {
		result_idx = entry->second;
	}
	result_set.push_back(result_idx);
}